

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

string * __thiscall
cmMakefile::GetDefaultConfiguration_abi_cxx11_(string *__return_storage_ptr__,cmMakefile *this)

{
  uint uVar1;
  cmGlobalGenerator *pcVar2;
  string *psVar3;
  allocator<char> local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *this_local;
  
  local_18 = this;
  this_local = (cmMakefile *)__return_storage_ptr__;
  pcVar2 = GetGlobalGenerator(this);
  uVar1 = (*pcVar2->_vptr_cmGlobalGenerator[0x26])();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CMAKE_BUILD_TYPE",&local_39);
    psVar3 = GetSafeDefinition(this,&local_38);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetDefaultConfiguration() const
{
  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    return std::string{};
  }
  return this->GetSafeDefinition("CMAKE_BUILD_TYPE");
}